

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-math.c
# Opt level: O3

int rtosc_arg_val_from_double(rtosc_arg_val_t *av,char type,double number)

{
  int iVar1;
  int iVar2;
  char cVar3;
  undefined7 in_register_00000031;
  
  av->type = type;
  iVar2 = 0;
  iVar1 = (int)CONCAT71(in_register_00000031,type);
  switch(iVar1) {
  case 99:
  case 0x69:
    (av->val).i = (int)number;
    break;
  case 100:
    (av->val).d = number;
    break;
  case 0x65:
  case 0x67:
    goto switchD_0010fa3a_caseD_65;
  case 0x66:
    (av->val).f = (float)number;
    break;
  case 0x68:
    (av->val).h = (long)number;
    break;
  default:
    if ((iVar1 != 0x46) && (iVar1 != 0x54)) {
      return 0;
    }
    cVar3 = 'F';
    if (number != 0.0) {
      cVar3 = 'T';
    }
    if (NAN(number)) {
      cVar3 = 'T';
    }
    (av->val).T = number != 0.0;
    av->type = cVar3;
  }
  iVar2 = 1;
switchD_0010fa3a_caseD_65:
  return iVar2;
}

Assistant:

int rtosc_arg_val_from_double(rtosc_arg_val_t* av, char type, double number)
{
    av->type = type;
    switch(type)
    {
        case 'h': av->val.h = number; return true;
        case 'd': av->val.d = number; return true;
        case 'f': av->val.f = number; return true;
        case 'c':
        case 'i': av->val.i = number; return true;
        case 'F':
        case 'T':
            // note: we discard av->type here!
            //       it's clear that the decision should be based on "number",
            //       not on the current type
            av->val.T = (number != 0.0);
            av->type = av->val.T ? 'T' : 'F';
            return true;
        default: return false;
    }
}